

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O2

uint32_t lzma_mf_hc4_find(lzma_mf *mf,lzma_match *matches)

{
  uint8_t *cur;
  uint32_t uVar1;
  uint32_t cur_match;
  uint8_t *puVar2;
  uint32_t *puVar3;
  bool bVar4;
  uint uVar5;
  lzma_match *plVar6;
  uint32_t pos;
  uint len_limit;
  char *__assertion;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  uint32_t uVar12;
  long lVar13;
  
  uVar7 = mf->read_pos;
  uVar5 = mf->write_pos - uVar7;
  len_limit = mf->nice_len;
  if ((uVar5 < mf->nice_len) && (len_limit = uVar5, uVar5 < 4)) {
    if (mf->action == LZMA_RUN) {
      __assert_fail("mf->action != LZMA_RUN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                    ,0x170,"uint32_t lzma_mf_hc4_find(lzma_mf *, lzma_match *)");
    }
    move_pending(mf);
    return 0;
  }
  puVar2 = mf->buffer;
  puVar3 = mf->hash;
  cur = puVar2 + uVar7;
  pos = mf->offset + uVar7;
  uVar5 = (uint)puVar2[(ulong)uVar7 + 1] ^ lzma_crc32_table[0][puVar2[uVar7]];
  uVar10 = (uint)puVar2[(ulong)uVar7 + 2] << 8 ^ uVar5;
  uVar5 = uVar5 & 0x3ff;
  uVar8 = (ulong)(uVar10 & 0xffff);
  uVar12 = puVar3[uVar5];
  uVar11 = pos - uVar12;
  uVar1 = puVar3[uVar8 + 0x400];
  uVar7 = ((lzma_crc32_table[0][puVar2[(ulong)uVar7 + 3]] << 5 ^ uVar10) & mf->hash_mask) + 0x10400;
  cur_match = puVar3[uVar7];
  puVar3[uVar5] = pos;
  puVar3[uVar8 + 0x400] = pos;
  puVar3[uVar7] = pos;
  uVar7 = mf->cyclic_size;
  uVar5 = 1;
  lVar13 = 0;
  bVar4 = true;
  uVar8 = (ulong)uVar11;
  if ((uVar11 < uVar7) && (cur[-uVar8] == *cur)) {
    matches->len = 2;
    matches->dist = uVar11 - 1;
    uVar5 = 2;
    lVar13 = 1;
    bVar4 = false;
  }
  if (((uVar1 == uVar12) || (uVar10 = pos - uVar1, uVar7 <= uVar10)) ||
     (cur[-(ulong)uVar10] != *cur)) {
    uVar11 = 0;
    if (bVar4) {
LAB_0019f848:
      uVar12 = 3;
      if (3 < uVar5) {
        uVar12 = uVar5;
      }
      plVar6 = hc_find_func(len_limit,pos,cur,cur_match,mf->depth,mf->son,mf->cyclic_pos,uVar7,
                            matches + uVar11,uVar12);
      uVar11 = (uint)((ulong)((long)plVar6 - (long)matches) >> 3);
      goto LAB_0019f889;
    }
    uVar11 = 1;
  }
  else {
    uVar11 = (int)lVar13 + 1;
    matches[lVar13].dist = uVar10 - 1;
    uVar5 = 3;
    uVar8 = (ulong)uVar10;
  }
  if (len_limit < uVar5) {
    __assertion = "len <= limit";
    uVar7 = 0x2e;
  }
  else {
    if (-1 < (int)len_limit) {
LAB_0019f807:
      if (uVar5 < len_limit) {
        uVar9 = *(long *)(cur + (uVar5 - uVar8)) - *(long *)(cur + uVar5);
        if (uVar9 == 0) goto code_r0x0019f819;
        uVar8 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
          }
        }
        uVar10 = ((uint)(uVar8 >> 3) & 0x1fffffff) + uVar5;
        uVar5 = uVar10;
        if (len_limit <= uVar10) {
          uVar5 = len_limit;
        }
        matches[(ulong)uVar11 - 1].len = uVar5;
        if (len_limit > uVar10) goto LAB_0019f848;
      }
      else {
        matches[(ulong)uVar11 - 1].len = len_limit;
      }
      mf->son[mf->cyclic_pos] = cur_match;
LAB_0019f889:
      move_pos(mf);
      return uVar11;
    }
    __assertion = "limit <= UINT32_MAX / 2";
    uVar7 = 0x2f;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                ,uVar7,
                "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)");
code_r0x0019f819:
  uVar5 = uVar5 + 8;
  goto LAB_0019f807;
}

Assistant:

extern uint32_t
lzma_mf_hc4_find(lzma_mf *mf, lzma_match *matches)
{
	header_find(false, 4);

	hash_4_calc();

	uint32_t delta2 = pos - mf->hash[hash_2_value];
	const uint32_t delta3
			= pos - mf->hash[FIX_3_HASH_SIZE + hash_3_value];
	const uint32_t cur_match = mf->hash[FIX_4_HASH_SIZE + hash_value];

	mf->hash[hash_2_value ] = pos;
	mf->hash[FIX_3_HASH_SIZE + hash_3_value] = pos;
	mf->hash[FIX_4_HASH_SIZE + hash_value] = pos;

	uint32_t len_best = 1;

	if (delta2 < mf->cyclic_size && *(cur - delta2) == *cur) {
		len_best = 2;
		matches[0].len = 2;
		matches[0].dist = delta2 - 1;
		matches_count = 1;
	}

	if (delta2 != delta3 && delta3 < mf->cyclic_size
			&& *(cur - delta3) == *cur) {
		len_best = 3;
		matches[matches_count++].dist = delta3 - 1;
		delta2 = delta3;
	}

	if (matches_count != 0) {
		len_best = lzma_memcmplen(cur - delta2, cur,
				len_best, len_limit);

		matches[matches_count - 1].len = len_best;

		if (len_best == len_limit) {
			hc_skip();
			return matches_count;
		}
	}

	if (len_best < 3)
		len_best = 3;

	hc_find(len_best);
}